

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int xar_read_header(archive_read *a,archive_entry *entry)

{
  archive_entry *paVar1;
  wchar_t wVar2;
  archive_string_conv *paVar3;
  int *piVar4;
  char *pcVar5;
  size_t local_58;
  size_t used;
  size_t outbytes;
  void *d;
  undefined8 *puStack_38;
  int r;
  xattr *xattr;
  xar_file *file;
  xar *xar;
  archive_entry *entry_local;
  archive_read *a_local;
  
  file = (xar_file *)a->format->data;
  d._4_4_ = 0;
  xar = (xar *)entry;
  entry_local = (archive_entry *)a;
  if (file->next == (xar_file *)0x0) {
    if (file[1].ctime == 0) {
      paVar3 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
      file[1].ctime = (time_t)paVar3;
      if (file[1].ctime == 0) {
        return -0x1e;
      }
    }
    d._4_4_ = read_toc((archive_read *)entry_local);
    if (d._4_4_ != 0) {
      return d._4_4_;
    }
  }
  while( true ) {
    xattr = (xattr *)heap_get_entry((heap_queue_conflict *)&file[1].length);
    *(xattr **)&file[1].subdirs = xattr;
    if ((xar_file *)xattr == (xar_file *)0x0) {
      file->subdirs = 1;
      return 1;
    }
    if (((((xar_file *)xattr)->mode & 0xf000) != 0x4000) || (((xar_file *)xattr)->has != 0x82))
    break;
    file_free((xar_file *)xattr);
  }
  if ((((xar_file *)xattr)->has & 0x20000) != 0) {
    archive_entry_set_atime((archive_entry *)xar,((xar_file *)xattr)->atime,0);
  }
  if (((xattr->name).buffer_length & 0x800000000000) != 0) {
    archive_entry_set_ctime((archive_entry *)xar,xattr[1].name.buffer_length,0);
  }
  if (((xattr->name).buffer_length & 0x1000000000000) != 0) {
    archive_entry_set_mtime((archive_entry *)xar,xattr[1].id,0);
  }
  archive_entry_set_gid((archive_entry *)xar,*(la_int64_t *)(xattr[1].a_sum.val + 0x10));
  if ((*(long *)xattr[1].a_sum.val != 0) &&
     (wVar2 = _archive_entry_copy_gname_l
                        ((archive_entry *)xar,(char *)xattr[1].a_sum.len,
                         *(size_t *)xattr[1].a_sum.val,(archive_string_conv *)file[1].ctime),
     wVar2 != L'\0')) {
    piVar4 = __errno_location();
    paVar1 = entry_local;
    if (*piVar4 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Gname");
      return -0x1e;
    }
    pcVar5 = archive_string_conversion_charset_name((archive_string_conv *)file[1].ctime);
    archive_set_error((archive *)paVar1,0x54,"Gname cannot be converted from %s to current locale.",
                      pcVar5);
    d._4_4_ = -0x14;
  }
  archive_entry_set_uid((archive_entry *)xar,*(la_int64_t *)&xattr[1].a_sum);
  if ((xattr[1].size != 0) &&
     (wVar2 = _archive_entry_copy_uname_l
                        ((archive_entry *)xar,(char *)xattr[1].offset,xattr[1].size,
                         (archive_string_conv *)file[1].ctime), wVar2 != L'\0')) {
    piVar4 = __errno_location();
    paVar1 = entry_local;
    if (*piVar4 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Uname");
      return -0x1e;
    }
    pcVar5 = archive_string_conversion_charset_name((archive_string_conv *)file[1].ctime);
    archive_set_error((archive *)paVar1,0x54,"Uname cannot be converted from %s to current locale.",
                      pcVar5);
    d._4_4_ = -0x14;
  }
  archive_entry_set_mode((archive_entry *)xar,xattr[1].e_sum.alg);
  wVar2 = _archive_entry_copy_pathname_l
                    ((archive_entry *)xar,(xattr->fstype).s,(xattr->fstype).length,
                     (archive_string_conv *)file[1].ctime);
  if (wVar2 != L'\0') {
    piVar4 = __errno_location();
    paVar1 = entry_local;
    if (*piVar4 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Pathname");
      return -0x1e;
    }
    pcVar5 = archive_string_conversion_charset_name((archive_string_conv *)file[1].ctime);
    archive_set_error((archive *)paVar1,0x54,
                      "Pathname cannot be converted from %s to current locale.",pcVar5);
    d._4_4_ = -0x14;
  }
  if ((xattr[1].name.s != (char *)0x0) &&
     (wVar2 = _archive_entry_copy_symlink_l
                        ((archive_entry *)xar,(char *)xattr[1].next,(size_t)xattr[1].name.s,
                         (archive_string_conv *)file[1].ctime), wVar2 != L'\0')) {
    piVar4 = __errno_location();
    paVar1 = entry_local;
    if (*piVar4 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Linkname");
      return -0x1e;
    }
    pcVar5 = archive_string_conversion_charset_name((archive_string_conv *)file[1].ctime);
    archive_set_error((archive *)paVar1,0x54,
                      "Linkname cannot be converted from %s to current locale.",pcVar5);
    d._4_4_ = -0x14;
  }
  if ((xattr[1].e_sum.alg & 0xf000U) == 0x4000) {
    archive_entry_set_nlink((archive_entry *)xar,(int)(xattr->name).buffer_length + 2);
  }
  else {
    archive_entry_set_nlink((archive_entry *)xar,*(uint *)((long)&xattr[2].next + 4));
  }
  archive_entry_set_size((archive_entry *)xar,xattr->size);
  if (xattr[2].name.length != 0) {
    archive_entry_set_hardlink((archive_entry *)xar,xattr[2].name.s);
  }
  archive_entry_set_ino64((archive_entry *)xar,*(la_int64_t *)(xattr[1].e_sum.val + 0x10));
  if (((xattr->name).buffer_length & 0x10000000000) != 0) {
    archive_entry_set_dev((archive_entry *)xar,xattr[1].e_sum.len);
  }
  if (((xattr->name).buffer_length & 0x20000000000) != 0) {
    archive_entry_set_devmajor((archive_entry *)xar,*(dev_t *)xattr[1].e_sum.val);
  }
  if (((xattr->name).buffer_length & 0x40000000000) != 0) {
    archive_entry_set_devminor((archive_entry *)xar,*(dev_t *)(xattr[1].e_sum.val + 8));
  }
  if (xattr[1].fstype.length != 0) {
    archive_entry_copy_fflags_text((archive_entry *)xar,xattr[1].fstype.s);
  }
  file[1].a_sum.alg = 1;
  file[1].a_sum.len = 0;
  *(uint64_t *)file[1].a_sum.val = xattr->length;
  *(uint64_t *)(file[1].a_sum.val + 0x10) = xattr->size;
  file[1].e_sum.alg = xattr->encoding;
  memcpy(&file[1].e_sum.len,&xattr->a_sum,0x28);
  memcpy(&file[1].pathname.length,&xattr->e_sum,0x28);
  puStack_38 = (undefined8 *)xattr[2].id;
  do {
    if (puStack_38 == (undefined8 *)0x0) {
LAB_0015c38b:
      if (d._4_4_ == 0) {
        if (*(long *)file[1].a_sum.val == 0) {
          d._4_4_ = 0;
        }
        else {
          d._4_4_ = move_reading_point((archive_read *)entry_local,xattr->offset);
        }
        file_free((xar_file *)xattr);
        a_local._4_4_ = d._4_4_;
      }
      else {
        file_free((xar_file *)xattr);
        a_local._4_4_ = d._4_4_;
      }
      return a_local._4_4_;
    }
    used = 0;
    local_58 = 0;
    d._4_4_ = move_reading_point((archive_read *)entry_local,puStack_38[6]);
    if ((d._4_4_ != 0) ||
       (d._4_4_ = rd_contents_init((archive_read *)entry_local,*(enctype *)(puStack_38 + 8),
                                   *(int *)(puStack_38 + 9),*(int *)(puStack_38 + 0xe)),
       d._4_4_ != 0)) goto LAB_0015c38b;
    outbytes = 0;
    d._4_4_ = rd_contents((archive_read *)entry_local,(void **)&outbytes,&used,&local_58,
                          puStack_38[5]);
    if (d._4_4_ != 0) goto LAB_0015c38b;
    if (used != puStack_38[7]) {
      archive_set_error((archive *)entry_local,-1,"Decompressed size error");
      d._4_4_ = -0x1e;
      goto LAB_0015c38b;
    }
    d._4_4_ = checksum_final((archive_read *)entry_local,puStack_38 + 0xb,puStack_38[10],
                             puStack_38 + 0x10,puStack_38[0xf]);
    if (d._4_4_ != 0) {
      archive_set_error((archive *)entry_local,-1,"Xattr checksum error");
      d._4_4_ = -0x14;
      goto LAB_0015c38b;
    }
    if (puStack_38[1] == 0) {
      archive_set_error((archive *)entry_local,-1,"Xattr name error");
      d._4_4_ = -0x14;
      goto LAB_0015c38b;
    }
    archive_entry_xattr_add_entry((archive_entry *)xar,(char *)puStack_38[1],(void *)outbytes,used);
    puStack_38 = (undefined8 *)*puStack_38;
  } while( true );
}

Assistant:

static int
xar_read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct xar_file *file;
	struct xattr *xattr;
	int r;

	xar = (struct xar *)(a->format->data);
	r = ARCHIVE_OK;

	if (xar->offset == 0) {
		/* Create a character conversion object. */
		if (xar->sconv == NULL) {
			xar->sconv = archive_string_conversion_from_charset(
			    &(a->archive), "UTF-8", 1);
			if (xar->sconv == NULL)
				return (ARCHIVE_FATAL);
		}

		/* Read TOC. */
		r = read_toc(a);
		if (r != ARCHIVE_OK)
			return (r);
	}

	for (;;) {
		file = xar->file = heap_get_entry(&(xar->file_queue));
		if (file == NULL) {
			xar->end_of_file = 1;
			return (ARCHIVE_EOF);
		}
		if ((file->mode & AE_IFMT) != AE_IFDIR)
			break;
		if (file->has != (HAS_PATHNAME | HAS_TYPE))
			break;
		/*
		 * If a file type is a directory and it does not have
		 * any metadata, do not export.
		 */
		file_free(file);
	}
        if (file->has & HAS_ATIME) {
          archive_entry_set_atime(entry, file->atime, 0);
        }
        if (file->has & HAS_CTIME) {
          archive_entry_set_ctime(entry, file->ctime, 0);
        }
        if (file->has & HAS_MTIME) {
          archive_entry_set_mtime(entry, file->mtime, 0);
        }
	archive_entry_set_gid(entry, file->gid);
	if (file->gname.length > 0 &&
	    archive_entry_copy_gname_l(entry, file->gname.s,
		archive_strlen(&(file->gname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Gname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_uid(entry, file->uid);
	if (file->uname.length > 0 &&
	    archive_entry_copy_uname_l(entry, file->uname.s,
		archive_strlen(&(file->uname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Uname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_mode(entry, file->mode);
	if (archive_entry_copy_pathname_l(entry, file->pathname.s,
	    archive_strlen(&(file->pathname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}


	if (file->symlink.length > 0 &&
	    archive_entry_copy_symlink_l(entry, file->symlink.s,
		archive_strlen(&(file->symlink)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Linkname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	/* Set proper nlink. */
	if ((file->mode & AE_IFMT) == AE_IFDIR)
		archive_entry_set_nlink(entry, file->subdirs + 2);
	else
		archive_entry_set_nlink(entry, file->nlink);
	archive_entry_set_size(entry, file->size);
	if (archive_strlen(&(file->hardlink)) > 0)
		archive_entry_set_hardlink(entry, file->hardlink.s);
	archive_entry_set_ino64(entry, file->ino64);
	if (file->has & HAS_DEV)
		archive_entry_set_dev(entry, file->dev);
	if (file->has & HAS_DEVMAJOR)
		archive_entry_set_devmajor(entry, file->devmajor);
	if (file->has & HAS_DEVMINOR)
		archive_entry_set_devminor(entry, file->devminor);
	if (archive_strlen(&(file->fflags_text)) > 0)
		archive_entry_copy_fflags_text(entry, file->fflags_text.s);

	xar->entry_init = 1;
	xar->entry_total = 0;
	xar->entry_remaining = file->length;
	xar->entry_size = file->size;
	xar->entry_encoding = file->encoding;
	xar->entry_a_sum = file->a_sum;
	xar->entry_e_sum = file->e_sum;
	/*
	 * Read extended attributes.
	 */
	xattr = file->xattr_list;
	while (xattr != NULL) {
		const void *d;
		size_t outbytes = 0;
		size_t used = 0;

		r = move_reading_point(a, xattr->offset);
		if (r != ARCHIVE_OK)
			break;
		r = rd_contents_init(a, xattr->encoding,
		    xattr->a_sum.alg, xattr->e_sum.alg);
		if (r != ARCHIVE_OK)
			break;
		d = NULL;
		r = rd_contents(a, &d, &outbytes, &used, xattr->length);
		if (r != ARCHIVE_OK)
			break;
		if (outbytes != xattr->size) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Decompressed size error");
			r = ARCHIVE_FATAL;
			break;
		}
		r = checksum_final(a,
		    xattr->a_sum.val, xattr->a_sum.len,
		    xattr->e_sum.val, xattr->e_sum.len);
		if (r != ARCHIVE_OK) {
#ifndef DONT_FAIL_ON_CRC_ERROR
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr checksum error");
			r = ARCHIVE_WARN;
			break;
#endif
		}
		if (xattr->name.s == NULL) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr name error");
			r = ARCHIVE_WARN;
			break;
		}
		archive_entry_xattr_add_entry(entry,
		    xattr->name.s, d, outbytes);
		xattr = xattr->next;
	}
	if (r != ARCHIVE_OK) {
		file_free(file);
		return (r);
	}

	if (xar->entry_remaining > 0)
		/* Move reading point to the beginning of current
		 * file contents. */
		r = move_reading_point(a, file->offset);
	else
		r = ARCHIVE_OK;

	file_free(file);
	return (r);
}